

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool quasiLexicographicalReverseLessThan(QFileInfo *fi1,QFileInfo *fi2)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFileInfo::baseName();
  QFileInfo::baseName();
  QVar3.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
  QVar3.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QVar4.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
  QVar4.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  iVar2 = QtPrivate::compareStrings(QVar3,QVar4,CaseSensitive);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,2,0x10);
  }
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,2,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0 < iVar2;
}

Assistant:

bool quasiLexicographicalReverseLessThan(const QFileInfo &fi1, const QFileInfo &fi2)
{
    QString s1 = fi1.baseName();
    QString s2 = fi2.baseName();

    if (s1.size() == s2.size())
        return s1 > s2;
    else
        return s1.size() > s2.size();
}